

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.cpp
# Opt level: O3

int __thiscall ev3dev::lego_port::connect(lego_port *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000034;
  
  if (connect(std::map<std::__cxx11::string,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>>>const&)
      ::_strClassDir_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&connect(std::map<std::__cxx11::string,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>>>const&)
                                 ::_strClassDir_abi_cxx11_,CONCAT44(in_register_00000034,__fd),
                                __addr,CONCAT44(in_register_0000000c,__len));
    if (iVar1 != 0) {
      connect(std::map<std::__cxx11::string,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>>>const&)
      ::_strClassDir_abi_cxx11_._M_dataplus._M_p =
           (pointer)&connect(std::map<std::__cxx11::string,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>>>const&)
                     ::_strClassDir_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 &connect(std::map<std::__cxx11::string,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>>>const&)
                  ::_strClassDir_abi_cxx11_,"/sys/class/lego-port/","");
      __cxa_atexit(std::__cxx11::string::~string,
                   &connect(std::map<std::__cxx11::string,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>>>const&)
                    ::_strClassDir_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&connect(std::map<std::__cxx11::string,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>>>const&)
                           ::_strClassDir_abi_cxx11_);
    }
  }
  if (connect(std::map<std::__cxx11::string,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>>>const&)
      ::_strPattern_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&connect(std::map<std::__cxx11::string,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>>>const&)
                                 ::_strPattern_abi_cxx11_);
    if (iVar1 != 0) {
      connect(std::map<std::__cxx11::string,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>>>const&)
      ::_strPattern_abi_cxx11_._M_dataplus._M_p =
           (pointer)&connect(std::map<std::__cxx11::string,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>>>const&)
                     ::_strPattern_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 &connect(std::map<std::__cxx11::string,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>>>const&)
                  ::_strPattern_abi_cxx11_,"port","");
      __cxa_atexit(std::__cxx11::string::~string,
                   &connect(std::map<std::__cxx11::string,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>>>const&)
                    ::_strPattern_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&connect(std::map<std::__cxx11::string,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>>>const&)
                           ::_strPattern_abi_cxx11_);
    }
  }
  iVar1 = device::connect(&this->super_device,0x11bb10,
                          (sockaddr *)
                          &connect(std::map<std::__cxx11::string,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>>>const&)
                           ::_strPattern_abi_cxx11_,__fd);
  return iVar1;
}

Assistant:

bool lego_port::connect(const std::map<std::string, std::set<std::string>> &match) noexcept
{
    static const std::string _strClassDir { SYS_ROOT "/lego-port/" };
    static const std::string _strPattern  { "port" };

    try {
        return device::connect(_strClassDir, _strPattern, match);
    } catch (...) { }

    _path.clear();

    return false;
}